

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementShellReissner4::SetAsNeutral(ChElementShellReissner4 *this)

{
  undefined8 uVar1;
  ChFrame<double> *pCVar2;
  undefined1 local_40 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  GetNodeA((ChElementShellReissner4 *)(local_40 + 0x10));
  uVar1 = local_40._16_8_;
  GetNodeA((ChElementShellReissner4 *)local_40);
  if ((_func_int **)(uVar1 + 0x208) != (_func_int **)(local_40._0_8_ + 0x20)) {
    *(_func_int **)(uVar1 + 0x208) = *(_func_int **)(local_40._0_8_ + 0x20);
    *(_func_int **)(uVar1 + 0x210) = *(_func_int **)(local_40._0_8_ + 0x28);
    *(_func_int **)(uVar1 + 0x218) = *(_func_int **)(local_40._0_8_ + 0x30);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  GetNodeB((ChElementShellReissner4 *)(local_40 + 0x10));
  uVar1 = local_40._16_8_;
  GetNodeB((ChElementShellReissner4 *)local_40);
  if ((_func_int **)(uVar1 + 0x208) != (_func_int **)(local_40._0_8_ + 0x20)) {
    *(_func_int **)(uVar1 + 0x208) = *(_func_int **)(local_40._0_8_ + 0x20);
    *(_func_int **)(uVar1 + 0x210) = *(_func_int **)(local_40._0_8_ + 0x28);
    *(_func_int **)(uVar1 + 0x218) = *(_func_int **)(local_40._0_8_ + 0x30);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  GetNodeC((ChElementShellReissner4 *)(local_40 + 0x10));
  uVar1 = local_40._16_8_;
  GetNodeC((ChElementShellReissner4 *)local_40);
  if ((_func_int **)(uVar1 + 0x208) != (_func_int **)(local_40._0_8_ + 0x20)) {
    *(_func_int **)(uVar1 + 0x208) = *(_func_int **)(local_40._0_8_ + 0x20);
    *(_func_int **)(uVar1 + 0x210) = *(_func_int **)(local_40._0_8_ + 0x28);
    *(_func_int **)(uVar1 + 0x218) = *(_func_int **)(local_40._0_8_ + 0x30);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  GetNodeD((ChElementShellReissner4 *)(local_40 + 0x10));
  uVar1 = local_40._16_8_;
  GetNodeD((ChElementShellReissner4 *)local_40);
  if ((_func_int **)(uVar1 + 0x208) != (_func_int **)(local_40._0_8_ + 0x20)) {
    *(_func_int **)(uVar1 + 0x208) = *(_func_int **)(local_40._0_8_ + 0x20);
    *(_func_int **)(uVar1 + 0x210) = *(_func_int **)(local_40._0_8_ + 0x28);
    *(_func_int **)(uVar1 + 0x218) = *(_func_int **)(local_40._0_8_ + 0x30);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  GetNodeA((ChElementShellReissner4 *)(local_40 + 0x10));
  pCVar2 = (ChFrame<double> *)(local_40._16_8_ + 0x200);
  GetNodeA((ChElementShellReissner4 *)local_40);
  ChFrame<double>::SetRot(pCVar2,(ChQuaternion<double> *)(local_40._0_8_ + 0x38));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  GetNodeB((ChElementShellReissner4 *)(local_40 + 0x10));
  pCVar2 = (ChFrame<double> *)(local_40._16_8_ + 0x200);
  GetNodeB((ChElementShellReissner4 *)local_40);
  ChFrame<double>::SetRot(pCVar2,(ChQuaternion<double> *)(local_40._0_8_ + 0x38));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  GetNodeC((ChElementShellReissner4 *)(local_40 + 0x10));
  pCVar2 = (ChFrame<double> *)(local_40._16_8_ + 0x200);
  GetNodeC((ChElementShellReissner4 *)local_40);
  ChFrame<double>::SetRot(pCVar2,(ChQuaternion<double> *)(local_40._0_8_ + 0x38));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  GetNodeD((ChElementShellReissner4 *)(local_40 + 0x10));
  GetNodeD((ChElementShellReissner4 *)local_40);
  ChFrame<double>::SetRot
            ((ChFrame<double> *)(local_40._16_8_ + 0x200),
             (ChQuaternion<double> *)(local_40._0_8_ + 0x38));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

void ChElementShellReissner4::SetAsNeutral() {
    GetNodeA()->GetX0ref().SetPos(GetNodeA()->GetPos());
    GetNodeB()->GetX0ref().SetPos(GetNodeB()->GetPos());
    GetNodeC()->GetX0ref().SetPos(GetNodeC()->GetPos());
    GetNodeD()->GetX0ref().SetPos(GetNodeD()->GetPos());
    GetNodeA()->GetX0ref().SetRot(GetNodeA()->GetRot());
    GetNodeB()->GetX0ref().SetRot(GetNodeB()->GetRot());
    GetNodeC()->GetX0ref().SetRot(GetNodeC()->GetRot());
    GetNodeD()->GetX0ref().SetRot(GetNodeD()->GetRot());
}